

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

double __thiscall
ON_SubDEdgeSharpness::SharpnessFromSliderValue
          (ON_SubDEdgeSharpness *this,ON_Interval slider_domain,double slider_value,
          double invalid_input_result)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  double local_70;
  double sharpness;
  ON_Interval ZeroToMaximumSharpness;
  double s;
  double invalid_input_result_local;
  double slider_value_local;
  ON_Interval slider_domain_local;
  
  slider_domain_local.m_t[0] = slider_domain.m_t[1];
  slider_value_local = slider_domain.m_t[0];
  bVar1 = ON_Interval::IsInterval((ON_Interval *)&slider_value_local);
  if (!bVar1) {
    return invalid_input_result;
  }
  dVar3 = ON_Interval::Min((ON_Interval *)&slider_value_local);
  if (slider_value < dVar3) {
    return invalid_input_result;
  }
  dVar3 = ON_Interval::Max((ON_Interval *)&slider_value_local);
  if (dVar3 < slider_value) {
    return invalid_input_result;
  }
  pdVar2 = ON_Interval::operator[]((ON_Interval *)&slider_value_local,0);
  if ((*pdVar2 == 0.0) && (!NAN(*pdVar2))) {
    pdVar2 = ON_Interval::operator[]((ON_Interval *)&slider_value_local,1);
    if ((*pdVar2 == 4.0) && (!NAN(*pdVar2))) {
      return slider_value;
    }
  }
  pdVar2 = ON_Interval::operator[]((ON_Interval *)&slider_value_local,0);
  if ((*pdVar2 == 0.0) && (!NAN(*pdVar2))) {
    pdVar2 = ON_Interval::operator[]((ON_Interval *)&slider_value_local,1);
    if ((*pdVar2 == 1.0) && (local_70 = slider_value, !NAN(*pdVar2))) goto LAB_0086fb08;
  }
  local_70 = ON_Interval::NormalizedParameterAt((ON_Interval *)&slider_value_local,slider_value);
LAB_0086fb08:
  ZeroToMaximumSharpness.m_t[1] = local_70;
  if ((0.0 <= local_70) && (local_70 <= 1.0)) {
    ON_Interval::ON_Interval((ON_Interval *)&sharpness,0.0,4.0);
    dVar3 = ON_Interval::ParameterAt((ON_Interval *)&sharpness,ZeroToMaximumSharpness.m_t[1]);
    dVar3 = Sanitize(dVar3,invalid_input_result);
    if ((0.0 <= dVar3) && (dVar3 <= 4.0)) {
      return dVar3;
    }
  }
  return invalid_input_result;
}

Assistant:

double ON_SubDEdgeSharpness::SharpnessFromSliderValue(
  ON_Interval slider_domain,
  double slider_value,
  double invalid_input_result
)
{
  if (slider_domain.IsInterval() && slider_value >= slider_domain.Min() && slider_value <= slider_domain.Max())
  {
    if (0.0 == slider_domain[0] && ON_SubDEdgeSharpness::MaximumValue == slider_domain[1])
      return slider_value;
    const double s = (0.0 == slider_domain[0] && 1.0 == slider_domain[1]) ? slider_value : slider_domain.NormalizedParameterAt(slider_value);
    if (s >= 0.0 && s <= 1.0)
    {
      const ON_Interval ZeroToMaximumSharpness(0.0, ON_SubDEdgeSharpness::MaximumValue);
      double sharpness = ON_SubDEdgeSharpness::Sanitize(ZeroToMaximumSharpness.ParameterAt(s), invalid_input_result);
      if (sharpness >= 0.0 && sharpness <= ON_SubDEdgeSharpness::MaximumValue)
        return sharpness;
    }
  }
  return invalid_input_result;
}